

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void CreateDefaultConstructorCode
               (ExpressionContext *ctx,SynBase *source,TypeClass *classType,
               IntrusiveList<ExprBase> *expressions)

{
  MemberHandle *pMVar1;
  VariableData *variable;
  MemberHandle *pMVar2;
  TypeBase *pTVar3;
  SynBase *pSVar4;
  TypeStruct *pTVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  ExprBase *pEVar9;
  ExprBase *address;
  TypeRef *type;
  undefined4 extraout_var;
  ExprBase *pEVar10;
  undefined4 extraout_var_00;
  ExprZeroInitialize *this;
  undefined4 extraout_var_01;
  ulong uVar11;
  IntrusiveList<MemberHandle> *pIVar12;
  SynBase *source_00;
  InplaceStr name;
  InplaceStr local_48;
  SynBase *local_38;
  
  pIVar12 = &(classType->super_TypeStruct).members;
  local_38 = source;
  do {
    pMVar1 = pIVar12->head;
    if (pMVar1 == (MemberHandle *)0x0) {
      return;
    }
    variable = pMVar1->variable;
    if (classType->baseClass == (TypeClass *)0x0) {
LAB_0015e054:
      pSVar4 = local_38;
      source_00 = pMVar1->source;
      if (pMVar1->source == (SynBase *)0x0) {
        source_00 = local_38;
      }
      uVar11 = 1;
      pEVar9 = CreateVariableAccess(ctx,source_00,variable,true);
      address = CreateGetAddress(ctx,pSVar4,pEVar9);
      local_48.begin = "$typeid";
      local_48.end = "";
      bVar7 = InplaceStr::operator==(&variable->name->name,&local_48);
      if (bVar7) {
        if (classType->baseClass != (TypeClass *)0x0) {
          bVar7 = HasDefaultConstructor(ctx,source_00,(TypeBase *)classType->baseClass);
          if (!bVar7) {
            __assert_fail("HasDefaultConstructor(ctx, memberSource, classType->baseClass)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x2783,
                          "void CreateDefaultConstructorCode(ExpressionContext &, SynBase *, TypeClass *, IntrusiveList<ExprBase> &)"
                         );
          }
          name.end = "";
          name.begin = "this";
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar11;
          pEVar9 = CreateVariableAccess
                             (ctx,source_00,(IntrusiveList<SynIdentifier>)(auVar6 << 0x40),name,
                              false);
          if (pEVar9 == (ExprBase *)0x0) {
            anon_unknown.dwarf_94284::Stop
                      (ctx,source_00,"ERROR: \'this\' variable is not available");
          }
          type = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType->baseClass);
          pEVar9 = CreateCast(ctx,source_00,pEVar9,&type->super_TypeBase,true);
          pEVar9 = CreateDefaultConstructorCall
                             (ctx,source_00,(TypeBase *)classType->baseClass,pEVar9);
          if (pEVar9 != (ExprBase *)0x0) {
            IntrusiveList<ExprBase>::push_back(expressions,pEVar9);
          }
        }
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar8);
        pTVar3 = ctx->typeTypeID;
        pEVar9->typeID = 8;
        pEVar9->source = source_00;
        pEVar9->type = pTVar3;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
        pEVar9[1]._vptr_ExprBase = (_func_int **)classType;
        pEVar9 = CreateAssignment(ctx,source_00,address,pEVar9);
LAB_0015e1aa:
        IntrusiveList<ExprBase>::push_back(expressions,pEVar9);
      }
      else {
        pSVar4 = pMVar1->initializer;
        if (pSVar4 == (SynBase *)0x0) {
          bVar7 = HasDefaultConstructor(ctx,source_00,variable->type);
          if (bVar7) {
            pEVar9 = CreateDefaultConstructorCall(ctx,source_00,variable->type,address);
            if (pEVar9 == (ExprBase *)0x0) goto LAB_0015e313;
            goto LAB_0015e1aa;
          }
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          this = (ExprZeroInitialize *)CONCAT44(extraout_var_01,iVar8);
          ExprZeroInitialize::ExprZeroInitialize(this,source_00,ctx->typeVoid,address);
        }
        else {
          pEVar10 = AnalyzeExpression(ctx,pSVar4);
          pEVar10 = ResolveInitializerValue(ctx,pSVar4,pEVar10);
          pTVar3 = variable->type;
          if ((((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x13)) ||
              ((pTVar5 = (TypeStruct *)pEVar10->type, pTVar5 != (TypeStruct *)0x0 &&
               ((pTVar5->super_TypeBase).typeID == 0x13)))) ||
             ((pTVar5 == ctx->typeAutoArray || (pTVar5 == ctx->typeAutoRef)))) {
            this = (ExprZeroInitialize *)CreateAssignment(ctx,pEVar10->source,pEVar9,pEVar10);
          }
          else {
            pEVar9 = CreateCast(ctx,pEVar10->source,pEVar10,(TypeBase *)pTVar3[1]._vptr_TypeBase,
                                false);
            iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            this = (ExprZeroInitialize *)CONCAT44(extraout_var_00,iVar8);
            pSVar4 = pEVar9->source;
            pTVar3 = ctx->typeVoid;
            (this->super_ExprBase).typeID = 0x20;
            (this->super_ExprBase).source = pSVar4;
            (this->super_ExprBase).type = pTVar3;
            (this->super_ExprBase).next = (ExprBase *)0x0;
            (this->super_ExprBase).listed = false;
            (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223fd0;
            this->address = address;
            this[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar9;
          }
        }
        IntrusiveList<ExprBase>::push_back(expressions,&this->super_ExprBase);
      }
    }
    else {
      bVar7 = false;
      pIVar12 = &(classType->baseClass->super_TypeStruct).members;
      while ((bVar7 == false && (pMVar2 = pIVar12->head, pMVar2 != (MemberHandle *)0x0))) {
        bVar7 = InplaceStr::operator==(&variable->name->name,&pMVar2->variable->name->name);
        pIVar12 = (IntrusiveList<MemberHandle> *)&pMVar2->next;
      }
      if (bVar7 == false) goto LAB_0015e054;
      local_48.begin = "$typeid";
      local_48.end = "";
      bVar7 = InplaceStr::operator!=(&variable->name->name,&local_48);
      if (!bVar7) goto LAB_0015e054;
    }
LAB_0015e313:
    pIVar12 = (IntrusiveList<MemberHandle> *)&pMVar1->next;
  } while( true );
}

Assistant:

void CreateDefaultConstructorCode(ExpressionContext &ctx, SynBase *source, TypeClass *classType, IntrusiveList<ExprBase> &expressions)
{
	for(MemberHandle *el = classType->members.head; el; el = el->next)
	{
		VariableData *variable = el->variable;

		if(TypeClass *base = classType->baseClass)
		{
			bool found = false;

			for(MemberHandle *baseMember = base->members.head; baseMember && !found; baseMember = baseMember->next)
				found = variable->name->name == baseMember->variable->name->name;

			if(found && variable->name->name != InplaceStr("$typeid"))
				continue;
		}

		SynBase *memberSource = el->source ? el->source : source;

		ExprBase *access = CreateVariableAccess(ctx, memberSource, variable, true);

		ExprBase *member = CreateGetAddress(ctx, source, access);

		if(variable->name->name == InplaceStr("$typeid"))
		{
			if(classType->baseClass)
			{
				assert(HasDefaultConstructor(ctx, memberSource, classType->baseClass));

				ExprBase *thisAccess = CreateVariableAccess(ctx, memberSource, IntrusiveList<SynIdentifier>(), InplaceStr("this"), false);

				if(!thisAccess)
					Stop(ctx, memberSource, "ERROR: 'this' variable is not available");

				ExprBase *cast = CreateCast(ctx, memberSource, thisAccess, ctx.GetReferenceType(classType->baseClass), true);

				if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, classType->baseClass, cast))
					expressions.push_back(call);
			}

			expressions.push_back(CreateAssignment(ctx, memberSource, member, new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(memberSource, ctx.typeTypeID, classType)));
			continue;
		}

		if(el->initializer)
		{
			ExprBase *initializer = ResolveInitializerValue(ctx, el->initializer, AnalyzeExpression(ctx, el->initializer));

			TypeArray *arrType = getType<TypeArray>(variable->type);

			// Single-level array might be set with a single element at the point of definition
			if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
			{
				initializer = CreateCast(ctx, initializer->source, initializer, arrType->subType, false);

				expressions.push_back(new (ctx.get<ExprArraySetup>()) ExprArraySetup(initializer->source, ctx.typeVoid, member, initializer));
			}
			else
			{
				expressions.push_back(CreateAssignment(ctx, initializer->source, access, initializer));
			}
		}
		else if(HasDefaultConstructor(ctx, memberSource, variable->type))
		{
			if(ExprBase *call = CreateDefaultConstructorCall(ctx, memberSource, variable->type, member))
				expressions.push_back(call);
		}
		else
		{
			expressions.push_back(new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(memberSource, ctx.typeVoid, member));
		}
	}
}